

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O1

RcvMsg * punpack(FILE *fdes)

{
  undefined4 uVar1;
  uint uVar2;
  RcvMsg *__ptr;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int line;
  CtxMsg *cmsg;
  ulong uVar6;
  undefined8 __ptr_00;
  size_t sVar7;
  ck_msg_type type;
  CheckMsg local_58;
  CtxMsg local_48;
  ck_msg_type local_44;
  FILE *local_40;
  char *local_38;
  
  __ptr = (RcvMsg *)emalloc(0x38);
  __ptr->lastctx = CK_CTX_INVALID;
  __ptr->failctx = CK_CTX_INVALID;
  __ptr->fixture_file = (char *)0x0;
  __ptr->msg = (char *)0x0;
  __ptr->duration = -1;
  __ptr->test_line = -1;
  __ptr->test_file = (char *)0x0;
  __ptr->fixture_line = -1;
  sVar3 = get_max_msg_size();
  pcVar4 = (char *)emalloc(sVar3 * 2);
  sVar3 = get_max_msg_size();
  sVar3 = read_buf(fdes,sVar3 * 2,pcVar4);
  if (sVar3 != 0) {
    sVar7 = 1;
    local_40 = fdes;
    do {
      uVar2 = upack(pcVar4,&local_58,&local_44);
      uVar1 = local_58.ctx_msg.ctx;
      if ((int)uVar2 < 0) {
        pcVar4 = "Error in call to upack";
        line = 0x195;
        goto LAB_001055c6;
      }
      switch(local_44) {
      case CK_MSG_CTX:
        if (__ptr->lastctx != CK_CTX_INVALID) {
          free(__ptr->fixture_file);
          __ptr->fixture_line = -1;
          __ptr->fixture_file = (char *)0x0;
        }
        __ptr->lastctx = uVar1;
        fdes = local_40;
        break;
      case CK_MSG_FAIL:
        if (__ptr->msg == (char *)0x0) {
          pcVar5 = strdup((char *)CONCAT44(local_58._4_4_,local_58.loc_msg.line));
          __ptr->msg = pcVar5;
          __ptr->failctx = __ptr->lastctx;
        }
        __ptr_00 = (char *)CONCAT44(local_58._4_4_,local_58.loc_msg.line);
        goto LAB_00105527;
      case CK_MSG_LOC:
        __ptr_00 = local_58.loc_msg.file;
        if (__ptr->failctx == CK_CTX_INVALID) {
          local_38 = local_58.loc_msg.file;
          local_48.ctx = (ck_result_ctx)local_58.ctx_msg.ctx;
          uVar6 = (ulong)(__ptr->lastctx == CK_CTX_TEST);
          free((&__ptr->fixture_file)[uVar6 * 2]);
          (&__ptr->fixture_line)[uVar6 * 4] = local_48.ctx;
          pcVar5 = strdup(local_38);
          (&__ptr->fixture_file)[uVar6 * 2] = pcVar5;
          __ptr_00 = local_58.loc_msg.file;
          fdes = local_40;
        }
LAB_00105527:
        free((void *)__ptr_00);
        break;
      case CK_MSG_DURATION:
        __ptr->duration = (int)local_58.ctx_msg.ctx;
        break;
      default:
        if (CK_MSG_DURATION < local_44) {
          eprintf("Bad message type arg %d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
                  ,0x1c0);
        }
      }
      uVar6 = (ulong)uVar2;
      sVar3 = sVar3 - uVar6;
      if ((long)sVar3 < 0) {
        pcVar4 = "Error in call to get_result";
        line = 0x20f;
LAB_001055c6:
        eprintf(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
                ,line);
      }
      memmove(pcVar4,pcVar4 + uVar6,sVar3);
      if (sVar7 == 0) {
        sVar7 = 0;
      }
      else {
        sVar7 = read_buf(fdes,uVar6,pcVar4 + sVar3);
        sVar3 = sVar3 + sVar7;
      }
    } while (sVar3 != 0);
  }
  free(pcVar4);
  if (__ptr->lastctx == CK_CTX_INVALID) {
    free(__ptr);
    __ptr = (RcvMsg *)0x0;
  }
  return __ptr;
}

Assistant:

RcvMsg *punpack(FILE * fdes)
{
    size_t nread, nparse;
    char *buf;
    RcvMsg *rmsg;

    rmsg = rcvmsg_create();

    /* Allcate a buffer */
    buf = (char *)emalloc(get_max_msg_size() * 2);
    /* Fill the buffer from the file */
    nread = read_buf(fdes, get_max_msg_size() * 2, buf);
    nparse = nread;
    /* While not all parsed */
    while(nparse > 0)
    {
        /* Parse one message */
        size_t n = get_result(buf, rmsg);
        if ( ((ssize_t) nparse - (ssize_t) n) < 0)    /* casting necessary to be able to get proper negative integers */
            eprintf("Error in call to get_result", __FILE__, __LINE__ - 5);
        nparse -= n;
        /* Move remaining data in buffer to the beginning */
        memmove(buf, buf + n, nparse);
        /* If EOF has not been seen */
        if(nread > 0)
        {
            /* Read more data into empty space at end of the buffer */
            nread = read_buf(fdes, (size_t) n, buf + nparse);
            nparse += nread;
        }
    }
    free(buf);

    if(rmsg->lastctx == CK_CTX_INVALID)
    {
        free(rmsg);
        rmsg = NULL;
    }

    return rmsg;
}